

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35081::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody
          (ArenaTest_FuzzAllocSpaceAllocatedRace_Test *this)

{
  uint uVar1;
  pointer ptVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  HiRep HVar5;
  char *pcVar6;
  anon_class_16_2_f6a74b90_for__M_head_impl *__args;
  thread *t;
  allocator_type *paVar7;
  ulong uVar8;
  bool bVar9;
  Time TVar10;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:618:40)>
  reset_max_block_size;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  upb_Arena *arena;
  Notification done;
  vector<std::thread,_std::allocator<std::thread>_> local_78;
  upb_Arena *local_58;
  undefined1 local_50 [16];
  Notification local_40;
  
  upb_Arena_SetMaxBlockSize(0x80);
  local_58 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  local_50._8_8_ = &local_58;
  local_50._0_8_ = &local_40;
  local_40.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  local_40.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar7 = (allocator_type *)
           __gnu_cxx::new_allocator<std::thread>::allocate
                     ((new_allocator<std::thread> *)&local_78,1,(void *)0x0);
  std::allocator_traits<std::allocator<std::thread>>::
  construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody()::__1>
            (paVar7,(thread *)local_50,__args);
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(paVar7 + 8);
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(paVar7 + 8);
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)paVar7;
  TVar10 = absl::lts_20250127::Now();
  local_50._0_8_ = TVar10.rep_.rep_hi_;
  local_50._8_4_ = TVar10.rep_.rep_lo_;
  uVar8 = 0;
  absl::lts_20250127::Duration::operator+=((Duration *)local_50,(Duration)ZEXT812(2));
  uVar4 = local_50._8_4_;
  uVar3 = local_50._0_8_;
  uVar1 = local_50._8_4_ + 1;
  do {
    TVar10 = absl::lts_20250127::Now();
    HVar5 = TVar10.rep_.rep_hi_;
    if (HVar5 == (HiRep)uVar3) {
      if (HVar5 == (HiRep)0x8000000000000000) {
        bVar9 = TVar10.rep_.rep_lo_ + 1 < uVar1;
      }
      else {
        bVar9 = TVar10.rep_.rep_lo_ < (uint)uVar4;
      }
    }
    else {
      bVar9 = (long)HVar5 < (long)uVar3;
    }
    if ((!bVar9) || (9999999 < uVar8)) break;
    pcVar6 = local_58->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)local_58->end_dont_copy_me__upb_internal_use_only - (long)pcVar6) < 0x80) {
      pcVar6 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(local_58,0x80);
    }
    else {
      if ((char *)((ulong)(pcVar6 + 7) & 0xfffffffffffffff8) != pcVar6) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      local_58->ptr_dont_copy_me__upb_internal_use_only = pcVar6 + 0x80;
    }
    uVar8 = uVar8 + 0x80;
  } while (pcVar6 != (char *)0x0);
  absl::lts_20250127::Notification::Notify(&local_40);
  ptVar2 = local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar7 = (allocator_type *)
                local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; paVar7 != (allocator_type *)ptVar2;
      paVar7 = paVar7 + 8) {
    std::thread::join();
  }
  upb_Arena_Free(local_58);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_78);
  absl::lts_20250127::Notification::~Notification(&local_40);
  upb_Arena_SetMaxBlockSize(0x8000);
  return;
}

Assistant:

TEST(ArenaTest, FuzzAllocSpaceAllocatedRace) {
  upb_Arena_SetMaxBlockSize(128);
  absl::Cleanup reset_max_block_size = [] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
  };
  upb_Arena* arena = upb_Arena_New();
  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 1; ++i) {
    threads.emplace_back([&]() {
      while (!done.HasBeenNotified()) {
        size_t count;
        upb_Arena_SpaceAllocated(arena, &count);
      }
    });
  }

  auto end = absl::Now() + absl::Seconds(2);
  uintptr_t total = 0;
  while (absl::Now() < end && total < 10000000) {
    if (upb_Arena_Malloc(arena, 128) == nullptr) {
      break;
    }
    total += 128;
  }
  done.Notify();
  for (auto& t : threads) t.join();
  upb_Arena_Free(arena);
}